

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

char * add_to_buffer(char *str,int fd,int *pos,char *buffer,int buffer_size,int *num_printed,
                    int print_percent)

{
  bool bVar1;
  int *num_printed_local;
  int buffer_size_local;
  char *buffer_local;
  int *pos_local;
  char *pcStack_10;
  int fd_local;
  char *str_local;
  
  pcStack_10 = str;
  while( true ) {
    bVar1 = false;
    if ((*pcStack_10 != '\0') && (bVar1 = true, print_percent == 0)) {
      bVar1 = *pcStack_10 != '%';
    }
    if (!bVar1) break;
    if (*pos < buffer_size) {
      buffer[*pos] = *pcStack_10;
    }
    else {
      gotcha_write(fd,buffer,(long)buffer_size);
      *num_printed = buffer_size + *num_printed;
      *pos = 0;
    }
    *pos = *pos + 1;
    pcStack_10 = pcStack_10 + 1;
  }
  return pcStack_10;
}

Assistant:

static const char *add_to_buffer(const char *str, int fd, int *pos,
                                 char *buffer, int buffer_size,
                                 int *num_printed, int print_percent) {
  for (; *str && (print_percent || *str != '%'); str++) {
    if (*pos >= buffer_size) {  // GCOVR_EXCL_START
      gotcha_write(fd, buffer, buffer_size);
      *num_printed += buffer_size;
      *pos = 0;
    }  // GCOVR_EXCL_STOP
    else {
      buffer[*pos] = *str;
    }
    *pos = *pos + 1;
  }
  return str;
}